

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColecoVision.cpp
# Opt level: O2

void __thiscall Coleco::Vision::Joystick::Joystick(Joystick *this)

{
  initializer_list<Inputs::Joystick::Input> __l;
  allocator_type local_149;
  _Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> local_148;
  Input local_130;
  undefined4 local_120;
  undefined8 local_118;
  undefined4 local_110;
  undefined8 local_108;
  undefined4 local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  undefined8 local_e8;
  undefined4 local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  undefined4 local_b8;
  undefined4 local_b0;
  undefined4 local_a8;
  undefined4 local_a0;
  undefined4 local_98;
  undefined4 local_90;
  undefined4 local_88;
  undefined4 local_80;
  undefined4 local_78;
  undefined4 local_70;
  undefined4 local_68;
  undefined4 local_60;
  undefined4 local_58;
  undefined4 local_50;
  undefined4 local_48;
  undefined4 local_40;
  undefined4 local_38;
  undefined4 local_30;
  undefined4 local_28;
  undefined4 local_20;
  undefined4 local_18;
  
  local_130.type = Up;
  local_130.info = (Info)0x0;
  local_120 = 1;
  local_118 = 0;
  local_110 = 2;
  local_108 = 0;
  local_100 = 3;
  local_f8 = 0;
  local_f0 = 6;
  local_e8 = 0;
  local_d8 = 1;
  local_d0 = 7;
  local_c8 = 0x30;
  local_b8 = 0x31;
  local_a8 = 0x32;
  local_98 = 0x33;
  local_88 = 0x34;
  local_78 = 0x35;
  local_68 = 0x36;
  local_58 = 0x37;
  local_48 = 0x38;
  local_38 = 0x39;
  local_28 = 0x2a;
  local_18 = 0x23;
  __l._M_len = 0x12;
  __l._M_array = &local_130;
  local_e0 = local_f0;
  local_c0 = local_d0;
  local_b0 = local_d0;
  local_a0 = local_d0;
  local_90 = local_d0;
  local_80 = local_d0;
  local_70 = local_d0;
  local_60 = local_d0;
  local_50 = local_d0;
  local_40 = local_d0;
  local_30 = local_d0;
  local_20 = local_d0;
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::vector
            ((vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> *)&local_148
             ,__l,&local_149);
  Inputs::ConcreteJoystick::ConcreteJoystick
            (&this->super_ConcreteJoystick,
             (vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> *)&local_148
            );
  std::_Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::
  ~_Vector_base(&local_148);
  (this->super_ConcreteJoystick).super_Joystick._vptr_Joystick =
       (_func_int **)&PTR__ConcreteJoystick_00582fe0;
  this->direction_ = 0xff;
  this->keypad_ = '\x7f';
  return;
}

Assistant:

Joystick() :
			ConcreteJoystick({
				Input(Input::Up),
				Input(Input::Down),
				Input(Input::Left),
				Input(Input::Right),

				Input(Input::Fire, 0),
				Input(Input::Fire, 1),

				Input('0'),	Input('1'),	Input('2'),
				Input('3'),	Input('4'),	Input('5'),
				Input('6'),	Input('7'),	Input('8'),
				Input('9'),	Input('*'),	Input('#'),
			}) {}